

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O3

int __thiscall delaunator::Delaunator::link(Delaunator *this,char *__from,char *__to)

{
  iterator iVar1;
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  pointer puVar2;
  runtime_error *this_00;
  char *pcVar3;
  ulong uVar4;
  char *local_38;
  size_t a_local;
  size_t b_local;
  
  puVar2 = (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar1._M_current =
       (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pcVar3 = (char *)((long)iVar1._M_current - (long)puVar2 >> 3);
  local_38 = __from;
  a_local = (size_t)__to;
  if (pcVar3 == __from) {
    if (iVar1._M_current ==
        (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->halfedges,iVar1,
                 &a_local);
      puVar2 = extraout_RAX;
    }
    else {
      *iVar1._M_current = (unsigned_long)__to;
      (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  else {
    if (pcVar3 <= __from) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Cannot link edge");
      goto LAB_0010a0fd;
    }
    puVar2[(long)__from] = (unsigned_long)__to;
  }
  if (a_local != 0xffffffffffffffff) {
    puVar2 = (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar1._M_current =
         (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish;
    uVar4 = (long)iVar1._M_current - (long)puVar2 >> 3;
    if (a_local == uVar4) {
      if (iVar1._M_current ==
          (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->halfedges,iVar1,
                   (unsigned_long *)&local_38);
        puVar2 = extraout_RAX_00;
      }
      else {
        *iVar1._M_current = (unsigned_long)__from;
        (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
    else {
      if (uVar4 <= a_local) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Cannot link edge");
LAB_0010a0fd:
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar2[a_local] = (unsigned_long)__from;
    }
  }
  return (int)puVar2;
}

Assistant:

void Delaunator::link(const std::size_t a, const std::size_t b) {
    std::size_t s = halfedges.size();
    if (a == s) {
        halfedges.push_back(b);
    } else if (a < s) {
        halfedges[a] = b;
    } else {
        throw std::runtime_error("Cannot link edge");
    }
    if (b != INVALID_INDEX) {
        std::size_t s2 = halfedges.size();
        if (b == s2) {
            halfedges.push_back(a);
        } else if (b < s2) {
            halfedges[b] = a;
        } else {
            throw std::runtime_error("Cannot link edge");
        }
    }
}